

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O0

int libj1939_add_socket_to_epoll(int epoll_fd,int sock,uint32_t events)

{
  uint __errnum;
  FILE *__stream;
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  uint32_t in_EDX;
  int in_ESI;
  int in_EDI;
  int ret;
  epoll_event ev;
  epoll_event local_1c;
  int local_c;
  int local_8;
  uint local_4;
  
  local_1c.data.u64._4_4_ = in_EDX;
  local_c = in_ESI;
  local_8 = in_EDI;
  memset(&local_1c,0,0xc);
  local_1c.events = local_1c.data.u64._4_4_;
  local_1c._4_4_ = local_c;
  iVar1 = epoll_ctl(local_8,1,local_c,&local_1c);
  if (iVar1 < 0) {
    puVar2 = (uint *)__errno_location();
    __stream = _stderr;
    __errnum = *puVar2;
    pcVar3 = strerror(__errnum);
    fprintf(__stream,"epoll_ctl(EPOLL_CTL_ADD): %d (%s)",(ulong)__errnum,pcVar3);
    local_4 = __errnum;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int libj1939_add_socket_to_epoll(int epoll_fd, int sock, uint32_t events)
{
	struct epoll_event ev = {0};
	int ret;

	ev.events = events;
	ev.data.fd = sock;

	ret = epoll_ctl(epoll_fd, EPOLL_CTL_ADD, sock, &ev);
	if (ret < 0) {
		ret = errno;
		pr_err("epoll_ctl(EPOLL_CTL_ADD): %d (%s)", ret, strerror(ret));
		return ret;
	}

	return 0;
}